

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.H
# Opt level: O1

void __thiscall Fl_Text_Display::previous_word(Fl_Text_Display *this)

{
  int pos;
  uint uVar1;
  int iVar2;
  Fl_Text_Buffer *this_00;
  
  pos = this->mCursorPos;
  if (pos == 0) {
    return;
  }
  this_00 = this->mBuffer;
  while ((((pos = Fl_Text_Buffer::prev_char(this_00,pos), pos != 0 &&
           (uVar1 = Fl_Text_Buffer::char_at(this->mBuffer,pos), uVar1 != 0x24)) && (uVar1 != 0x5f))
         && ((iVar2 = isspace(uVar1), iVar2 != 0 || (iVar2 = ispunct(uVar1), iVar2 != 0))))) {
    this_00 = this->mBuffer;
  }
  while ((pos != 0 &&
         (((uVar1 = Fl_Text_Buffer::char_at(this->mBuffer,pos), uVar1 == 0x24 || (uVar1 == 0x5f)) ||
          ((iVar2 = isspace(uVar1), iVar2 == 0 && (iVar2 = ispunct(uVar1), iVar2 == 0))))))) {
    pos = Fl_Text_Buffer::prev_char(this->mBuffer,pos);
  }
  uVar1 = Fl_Text_Buffer::char_at(this->mBuffer,pos);
  if (((uVar1 != 0x24) && (uVar1 != 0x5f)) &&
     ((iVar2 = isspace(uVar1), iVar2 != 0 || (iVar2 = ispunct(uVar1), iVar2 != 0)))) {
    pos = Fl_Text_Buffer::next_char(this->mBuffer,pos);
  }
  insert_position(this,pos);
  return;
}

Assistant:

int insert_position() const { return mCursorPos; }